

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

void mp_rshd(mp_int *a,int b)

{
  int in_ESI;
  mp_int *in_RDI;
  mp_digit *top;
  mp_digit *bottom;
  int x;
  mp_digit *local_20;
  mp_digit *local_18;
  int local_10;
  
  if (0 < in_ESI) {
    if (in_ESI < in_RDI->used) {
      local_20 = in_RDI->dp + in_ESI;
      local_18 = in_RDI->dp;
      for (local_10 = 0; local_10 < in_RDI->used - in_ESI; local_10 = local_10 + 1) {
        *local_18 = *local_20;
        local_20 = local_20 + 1;
        local_18 = local_18 + 1;
      }
      for (; local_10 < in_RDI->used; local_10 = local_10 + 1) {
        *local_18 = 0;
        local_18 = local_18 + 1;
      }
      in_RDI->used = in_RDI->used - in_ESI;
    }
    else {
      mp_zero(in_RDI);
    }
  }
  return;
}

Assistant:

void mp_rshd (mp_int * a, int b)
{
  int     x;

  /* if b <= 0 then ignore it */
  if (b <= 0) {
    return;
  }

  /* if b > used then simply zero it and return */
  if (a->used <= b) {
    mp_zero (a);
    return;
  }

  {
    register mp_digit *bottom, *top;

    /* shift the digits down */

    /* bottom */
    bottom = a->dp;

    /* top [offset into digits] */
    top = a->dp + b;

    /* this is implemented as a sliding window where 
     * the window is b-digits long and digits from 
     * the top of the window are copied to the bottom
     *
     * e.g.

     b-2 | b-1 | b0 | b1 | b2 | ... | bb |   ---->
                 /\                   |      ---->
                  \-------------------/      ---->
     */
    for (x = 0; x < (a->used - b); x++) {
      *bottom++ = *top++;
    }

    /* zero the top digits */
    for (; x < a->used; x++) {
      *bottom++ = 0;
    }
  }
  
  /* remove excess digits */
  a->used -= b;
}